

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O1

parasail_profile_t *
parasail_profile_create_sse_128_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  parasail_profile_t *ppVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  __m128i_64_t t;
  long local_48 [3];
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_sse_128_64_cold_2();
  }
  else if (s1 == (char *)0x0 && matrix->type == 0) {
    parasail_profile_create_sse_128_64_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar2 = matrix->size;
    uVar7 = (_s1Len - (_s1Len + 1 >> 0x1f)) + 1 >> 1;
    pvVar4 = parasail_memalign(0x10,(long)(int)(uVar7 * uVar2) << 4);
    if ((pvVar4 != (void *)0x0) &&
       (ppVar5 = parasail_profile_new(s1,_s1Len,matrix), ppVar5 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar2) {
        uVar6 = 1;
        if (1 < (int)uVar7) {
          uVar6 = (ulong)uVar7;
        }
        uVar15 = 0;
        lVar11 = 0;
        do {
          if (0 < _s1Len) {
            lVar11 = (long)(int)lVar11;
            uVar12 = 0;
            do {
              iVar3 = matrix->type;
              lVar14 = 0;
              uVar13 = uVar12;
              do {
                if (iVar3 == 0) {
                  if ((int)uVar13 < _s1Len) {
                    pbVar8 = (byte *)(s1 + uVar13);
                    uVar9 = uVar15;
                    goto LAB_0059f94e;
                  }
LAB_0059f96e:
                  lVar10 = 0;
                }
                else {
                  if (_s1Len <= (int)uVar13) goto LAB_0059f96e;
                  pbVar8 = (byte *)(matrix->alphabet + uVar15);
                  uVar9 = uVar13;
LAB_0059f94e:
                  lVar10 = (long)matrix->matrix
                                 [(long)(int)((int)uVar9 * uVar2) + (long)matrix->mapper[*pbVar8]];
                }
                local_48[lVar14] = lVar10;
                uVar13 = uVar13 + uVar7;
                lVar14 = lVar14 + 1;
              } while (lVar14 == 1);
              plVar1 = (long *)((long)pvVar4 + lVar11 * 0x10);
              *plVar1 = local_48[0];
              plVar1[1] = local_48[1];
              lVar11 = lVar11 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar6);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar2);
      }
      (ppVar5->profile64).score = pvVar4;
      ppVar5->free = parasail_free___m128i;
      return ppVar5;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_sse_128_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 2; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_64_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->free = &parasail_free___m128i;
    return profile;
}